

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O3

void processEnvironment(string *command,string *classification,CWLDef *data)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  __hashtable *__h;
  long *plVar5;
  ulong uVar6;
  string envName;
  string type;
  long *local_98 [2];
  long local_88 [2];
  undefined4 local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  lVar4 = std::__cxx11::string::find((char)command,0x7d);
  if (lVar4 == -1) {
    return;
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)command);
  lVar4 = std::__cxx11::string::find((char)classification,0x5c);
  if (lVar4 == -1) {
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>((string *)local_98,local_70,local_68 + (long)local_70)
    ;
    local_78 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&data->environments);
    plVar5 = local_98[0];
    if (local_98[0] == local_88) goto LAB_0017b500;
  }
  else {
    local_50 = (long *)&local_40;
    local_48 = 0;
    local_40 = 0;
    uVar6 = lVar4 + 1;
    uVar1 = classification->_M_string_length;
    if (uVar6 < uVar1) {
      pcVar2 = (classification->_M_dataplus)._M_p;
      do {
        iVar3 = isalpha((int)pcVar2[uVar6]);
        if (iVar3 == 0) break;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    std::__cxx11::string::substr((ulong)local_98,(ulong)classification);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_98);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    local_98[0] = local_88;
    if (iVar3 == 0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_70,local_68 + (long)local_70);
      local_78 = 1;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&data->environments);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar3 == 0) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,local_70,local_68 + (long)local_70);
        local_78 = 4;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&data->environments);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar3 == 0) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,local_70,local_68 + (long)local_70);
          local_78 = 2;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&data->environments);
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,local_70,local_68 + (long)local_70);
          local_78 = 0;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&data->environments);
        }
      }
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    if (local_50 == (long *)&local_40) goto LAB_0017b500;
    local_88[0] = CONCAT71(uStack_3f,local_40);
    plVar5 = local_50;
  }
  operator_delete(plVar5,local_88[0] + 1);
LAB_0017b500:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void processEnvironment (string &command, string &classification, CWLDef &data) {
    auto envNameEnd = command.find('}');
    if (envNameEnd == string::npos) { return; }
    string envName = command.substr(7, envNameEnd - 7); // command == \begin{name}

    auto typeStart = classification.find('\\');
    if (typeStart == string::npos) {
        data.environments.insert({envName, CWL::EnvKind::General});
    } else {
        string type {};
        auto i = ++typeStart;
        for (; i < classification.size(); i++) {
            if (!isalpha(classification[i])) { break; }
        }

        type = classification.substr(typeStart, i - typeStart);

        if (type == "math") {
            data.environments.insert({envName, CWL::EnvKind::Math});
        } else if (type == "tabular") {
            data.environments.insert({envName, CWL::EnvKind::Tabular});
        } else if (type == "array") {
            data.environments.insert({envName, CWL::EnvKind::Array});
        } else {
            data.environments.insert({envName, CWL::EnvKind::General});
        }
    }
}